

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art_iter.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_d5c8::
ARTIteratorTest_I4AndTwoLeavesReverseScan_Test<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::TestBody(ARTIteratorTest_I4AndTwoLeavesReverseScan_Test<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  value_view v;
  value_view v_00;
  bool bVar1;
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  *this_00;
  const_reference pvVar2;
  char *pcVar3;
  char *in_R9;
  key_view akey;
  key_view akey_00;
  string local_4b0;
  AssertHelper local_490;
  Message local_488;
  bool local_479;
  undefined1 local_478 [8];
  AssertionResult gtest_ar__4;
  bool in_stack_fffffffffffffbb7;
  AssertHelper in_stack_fffffffffffffbb8;
  Message local_440 [2];
  value_view local_430;
  bool local_419;
  undefined1 local_418 [8];
  AssertionResult gtest_ar__3;
  Message local_400;
  int local_3f4;
  key_view local_3f0;
  uint64_t local_3e0;
  undefined1 local_3d8 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_3a8;
  Message local_3a0;
  bool local_391;
  undefined1 local_390 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_360;
  Message local_358 [2];
  value_view local_348;
  bool local_331;
  undefined1 local_330 [8];
  AssertionResult gtest_ar__1;
  Message local_318;
  int local_30c;
  key_view local_308;
  uint64_t local_2f8;
  undefined1 local_2f0 [8];
  AssertionResult gtest_ar;
  AssertHelper local_2c0;
  Message local_2b8;
  bool local_2a9;
  undefined1 local_2a8 [8];
  AssertionResult gtest_ar_;
  iterator b;
  TypeParam *db;
  tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  verifier;
  ARTIteratorTest_I4AndTwoLeavesReverseScan_Test<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  *this_local;
  
  verifier.key_views.
  super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  unodb::test::
  tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::tree_verifier((tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                   *)in_stack_fffffffffffffbb8.data_,in_stack_fffffffffffffbb7);
  this_00 = unodb::test::
            tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
            ::get_db((tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                      *)&db);
  pvVar2 = std::array<std::span<const_std::byte,_18446744073709551615UL>,_6UL>::operator[]
                     ((array<std::span<const_std::byte,_18446744073709551615UL>,_6UL> *)
                      unodb::test::test_values,0);
  v._M_ptr = pvVar2->_M_ptr;
  v._M_extent._M_extent_value = (pvVar2->_M_extent)._M_extent_value;
  unodb::test::
  tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::insert<int>((tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                 *)&db,0,v,false);
  pvVar2 = std::array<std::span<const_std::byte,_18446744073709551615UL>,_6UL>::operator[]
                     ((array<std::span<const_std::byte,_18446744073709551615UL>,_6UL> *)
                      unodb::test::test_values,1);
  v_00._M_ptr = pvVar2->_M_ptr;
  v_00._M_extent._M_extent_value = (pvVar2->_M_extent)._M_extent_value;
  unodb::test::
  tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::insert<int>((tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                 *)&db,1,v_00,false);
  unodb::
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::test_only_iterator((iterator *)&gtest_ar_.message_,this_00);
  unodb::
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::last((iterator *)&gtest_ar_.message_);
  local_2a9 = unodb::
              db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              ::iterator::valid((iterator *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2a8,&local_2a9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a8);
  if (!bVar1) {
    testing::Message::Message(&local_2b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_2a8,(AssertionResult *)"b.valid()",
               "false","true",in_R9);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_2c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x71,pcVar3);
    testing::internal::AssertHelper::operator=(&local_2c0,&local_2b8);
    testing::internal::AssertHelper::~AssertHelper(&local_2c0);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_2b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a8);
  local_308 = unodb::
              db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              ::iterator::get_key((iterator *)&gtest_ar_.message_);
  akey._M_extent = local_308._M_extent._M_extent_value;
  akey._M_ptr = (pointer)akey._M_extent._M_extent_value;
  local_2f8 = decode((anon_unknown_dwarf_d5c8 *)local_308._M_ptr,akey);
  local_30c = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_2f0,"(decode(b.get_key()))","(1)",&local_2f8,&local_30c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f0);
  if (!bVar1) {
    testing::Message::Message(&local_318);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x73,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_318);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_318);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f0);
  local_348 = unodb::
              db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              ::iterator::get_val((iterator *)&gtest_ar_.message_);
  pvVar2 = std::array<std::span<const_std::byte,_18446744073709551615UL>,_6UL>::operator[]
                     ((array<std::span<const_std::byte,_18446744073709551615UL>,_6UL> *)
                      unodb::test::test_values,1);
  local_331 = std::ranges::__equal_fn::
              operator()<std::span<const_std::byte,_18446744073709551615UL>,_const_std::span<const_std::byte,_18446744073709551615UL>_&,_std::ranges::equal_to,_std::identity,_std::identity>
                        ((__equal_fn *)&std::ranges::equal,&local_348,pvVar2);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_330,&local_331,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_330);
  if (!bVar1) {
    testing::Message::Message(local_358);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_330,
               (AssertionResult *)"std::ranges::equal(b.get_val(), unodb::test::test_values[1])",
               "false","true",in_R9);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__2.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_360,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x75,pcVar3);
    testing::internal::AssertHelper::operator=(&local_360,local_358);
    testing::internal::AssertHelper::~AssertHelper(&local_360);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(local_358);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_330);
  unodb::
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::prior((iterator *)&gtest_ar_.message_);
  local_391 = unodb::
              db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              ::iterator::valid((iterator *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_390,&local_391,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_390);
  if (!bVar1) {
    testing::Message::Message(&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1.message_,(internal *)local_390,(AssertionResult *)"b.valid()",
               "false","true",in_R9);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_1.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x78,pcVar3);
    testing::internal::AssertHelper::operator=(&local_3a8,&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_3a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_390);
  local_3f0 = unodb::
              db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              ::iterator::get_key((iterator *)&gtest_ar_.message_);
  akey_00._M_extent = local_3f0._M_extent._M_extent_value;
  akey_00._M_ptr = (pointer)akey_00._M_extent._M_extent_value;
  local_3e0 = decode((anon_unknown_dwarf_d5c8 *)local_3f0._M_ptr,akey_00);
  local_3f4 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_3d8,"(decode(b.get_key()))","(0)",&local_3e0,&local_3f4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3d8);
  if (!bVar1) {
    testing::Message::Message(&local_400);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x7a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3.message_,&local_400);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_400);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d8);
  local_430 = unodb::
              db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              ::iterator::get_val((iterator *)&gtest_ar_.message_);
  pvVar2 = std::array<std::span<const_std::byte,_18446744073709551615UL>,_6UL>::operator[]
                     ((array<std::span<const_std::byte,_18446744073709551615UL>,_6UL> *)
                      unodb::test::test_values,0);
  local_419 = std::ranges::__equal_fn::
              operator()<std::span<const_std::byte,_18446744073709551615UL>,_const_std::span<const_std::byte,_18446744073709551615UL>_&,_std::ranges::equal_to,_std::identity,_std::identity>
                        ((__equal_fn *)&std::ranges::equal,&local_430,pvVar2);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_418,&local_419,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_418);
  if (!bVar1) {
    testing::Message::Message(local_440);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4.message_,(internal *)local_418,
               (AssertionResult *)"std::ranges::equal(b.get_val(), unodb::test::test_values[0])",
               "false","true",in_R9);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__4.message_);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffbb8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x7c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xfffffffffffffbb8,local_440);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffbb8);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(local_440);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_418);
  unodb::
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::prior((iterator *)&gtest_ar_.message_);
  local_479 = unodb::
              db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              ::iterator::valid((iterator *)&gtest_ar_.message_);
  local_479 = !local_479;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_478,&local_479,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_478);
  if (!bVar1) {
    testing::Message::Message(&local_488);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_4b0,(internal *)local_478,(AssertionResult *)"b.valid()","true","false",in_R9)
    ;
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&local_4b0);
    testing::internal::AssertHelper::AssertHelper
              (&local_490,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x7f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_490,&local_488);
    testing::internal::AssertHelper::~AssertHelper(&local_490);
    std::__cxx11::string::~string((string *)&local_4b0);
    testing::Message::~Message(&local_488);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_478);
  unodb::
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::~iterator((iterator *)&gtest_ar_.message_);
  unodb::test::
  tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::~tree_verifier((tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                    *)&db);
  return;
}

Assistant:

UNODB_TYPED_TEST(ARTIteratorTest, I4AndTwoLeavesReverseScan) {
  unodb::test::tree_verifier<TypeParam> verifier;
  TypeParam& db = verifier.get_db();  // reference to test db instance.
  verifier.insert(0, unodb::test::test_values[0]);
  verifier.insert(1, unodb::test::test_values[1]);
  auto b = db.test_only_iterator();
  b.last();
  UNODB_EXPECT_TRUE(b.valid());
  {
    UNODB_EXPECT_EQ(decode(b.get_key()), 1);
    UNODB_EXPECT_TRUE(
        std::ranges::equal(b.get_val(), unodb::test::test_values[1]));
  }
  b.prior();
  UNODB_EXPECT_TRUE(b.valid());
  {
    UNODB_EXPECT_EQ(decode(b.get_key()), 0);
    UNODB_EXPECT_TRUE(
        std::ranges::equal(b.get_val(), unodb::test::test_values[0]));
  }
  b.prior();
  UNODB_EXPECT_FALSE(b.valid());  // nothing more in the iterator.
}